

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

void __thiscall
draco::OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
          (OctahedronToolBox *this,float *vector,int32_t *out_s,int32_t *out_t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *in_RSI;
  int iVar4;
  long in_RDI;
  long lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int32_t *out_t_00;
  double extraout_XMM0_Qa_01;
  double dVar6;
  int32_t int_vec [3];
  double scale;
  double scaled_vector [3];
  double abs_sum;
  undefined4 in_stack_ffffffffffffffa0;
  OctahedronToolBox *in_stack_ffffffffffffffb0;
  double local_48;
  double local_40;
  double local_38;
  
  lVar5 = in_RDI;
  std::abs((int)in_RDI);
  iVar4 = (int)lVar5;
  std::abs(iVar4);
  out_t_00 = (int32_t *)(extraout_XMM0_Qa + extraout_XMM0_Qa_00);
  std::abs(iVar4);
  if ((double)out_t_00 + extraout_XMM0_Qa_01 <= 1e-06) {
    local_48 = 1.0;
    local_40 = 0.0;
    local_38 = 0.0;
  }
  else {
    in_stack_ffffffffffffffb0 =
         (OctahedronToolBox *)(1.0 / ((double)out_t_00 + extraout_XMM0_Qa_01));
    local_48 = (double)*in_RSI * (double)in_stack_ffffffffffffffb0;
    local_40 = (double)in_RSI[1] * (double)in_stack_ffffffffffffffb0;
    local_38 = (double)in_RSI[2] * (double)in_stack_ffffffffffffffb0;
  }
  dVar6 = floor(local_48 * (double)*(int *)(in_RDI + 0x10) + 0.5);
  iVar2 = (int)dVar6;
  dVar6 = floor(local_40 * (double)*(int *)(in_RDI + 0x10) + 0.5);
  iVar3 = (int)dVar6;
  iVar4 = iVar2;
  if (iVar2 < 1) {
    iVar4 = -iVar2;
  }
  iVar1 = iVar3;
  if (iVar3 < 1) {
    iVar1 = -iVar3;
  }
  iVar1 = (*(int *)(in_RDI + 0x10) - iVar4) - iVar1;
  if (iVar1 < 0) {
    if (iVar3 < 1) {
      iVar1 = -iVar1;
    }
    iVar3 = iVar1 + iVar3;
    iVar1 = 0;
  }
  if (local_38 < 0.0) {
    iVar1 = -iVar1;
  }
  IntegerVectorToQuantizedOctahedralCoords
            (in_stack_ffffffffffffffb0,(int32_t *)CONCAT44(iVar1,iVar3),
             (int32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),out_t_00);
  return;
}

Assistant:

void FloatVectorToQuantizedOctahedralCoords(const T *vector, int32_t *out_s,
                                              int32_t *out_t) const {
    const double abs_sum = std::abs(static_cast<double>(vector[0])) +
                           std::abs(static_cast<double>(vector[1])) +
                           std::abs(static_cast<double>(vector[2]));

    // Adjust values such that abs sum equals 1.
    double scaled_vector[3];
    if (abs_sum > 1e-6) {
      // Scale needed to project the vector to the surface of an octahedron.
      const double scale = 1.0 / abs_sum;
      scaled_vector[0] = vector[0] * scale;
      scaled_vector[1] = vector[1] * scale;
      scaled_vector[2] = vector[2] * scale;
    } else {
      scaled_vector[0] = 1.0;
      scaled_vector[1] = 0;
      scaled_vector[2] = 0;
    }

    // Scale vector such that the sum equals the center value.
    int32_t int_vec[3];
    int_vec[0] =
        static_cast<int32_t>(floor(scaled_vector[0] * center_value_ + 0.5));
    int_vec[1] =
        static_cast<int32_t>(floor(scaled_vector[1] * center_value_ + 0.5));
    // Make sure the sum is exactly the center value.
    int_vec[2] = center_value_ - std::abs(int_vec[0]) - std::abs(int_vec[1]);
    if (int_vec[2] < 0) {
      // If the sum of first two coordinates is too large, we need to decrease
      // the length of one of the coordinates.
      if (int_vec[1] > 0) {
        int_vec[1] += int_vec[2];
      } else {
        int_vec[1] -= int_vec[2];
      }
      int_vec[2] = 0;
    }
    // Take care of the sign.
    if (scaled_vector[2] < 0) {
      int_vec[2] *= -1;
    }

    IntegerVectorToQuantizedOctahedralCoords(int_vec, out_s, out_t);
  }